

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

Slice __thiscall arangodb::velocypack::Builder::getKey(Builder *this,string_view key)

{
  string_view attribute;
  bool bVar1;
  const_reference pvVar2;
  undefined8 uVar3;
  reference puVar4;
  uint8_t *puVar5;
  ValueLength VVar6;
  char *in_RDX;
  size_t in_RSI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  Slice s;
  const_iterator indexEnd;
  const_iterator indexStart;
  ValueLength indexStartPos;
  ValueLength pos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  Exception *in_stack_ffffffffffffff70;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  Slice local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  ValueLength local_30;
  ValueLength local_28;
  size_t local_18;
  char *local_10;
  Slice local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDX;
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_ffffffffffffff70,(ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  pvVar2 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffff70);
  local_28 = pvVar2->startPos;
  pvVar2 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffff70);
  local_30 = pvVar2->indexStartPos;
  bVar1 = false;
  if (*(char *)(*(long *)(in_RDI + 0x18) + local_28) != '\v') {
    bVar1 = *(char *)(*(long *)(in_RDI + 0x18) + local_28) != '\x14';
  }
  if (!bVar1) {
    local_40 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_ffffffffffffff68);
    local_38 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffff78,(difference_type)in_stack_ffffffffffffff70);
    local_48 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff68);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Slice::Slice((Slice *)0x11557e);
        return (Slice)local_8._start;
      }
      in_stack_ffffffffffffff70 = (Exception *)(*(long *)(in_RDI + 0x18) + local_28);
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38);
      Slice::Slice(&local_50,&in_stack_ffffffffffffff70->field_0x0 + *puVar4);
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                (in_stack_ffffffffffffff78);
      attribute._M_str = local_10;
      attribute._M_len = local_18;
      bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isEqualString
                        (in_RDI,attribute);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_38);
    }
    puVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x11553e);
    VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       in_stack_ffffffffffffff70);
    Slice::Slice(&local_8,puVar5 + VVar6);
    return (Slice)local_8._start;
  }
  uVar3 = __cxa_allocate_exception(0x18);
  Exception::Exception
            (in_stack_ffffffffffffff70,(ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Slice Builder::getKey(std::string_view key) const {
  if (VELOCYPACK_UNLIKELY(_stack.empty())) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  VELOCYPACK_ASSERT(!_stack.empty());
  ValueLength const pos = _stack.back().startPos;
  ValueLength const indexStartPos = _stack.back().indexStartPos;
  if (VELOCYPACK_UNLIKELY(_start[pos] != 0x0b && _start[pos] != 0x14)) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  std::vector<ValueLength>::const_iterator indexStart =
      _indexes.begin() + indexStartPos;
  std::vector<ValueLength>::const_iterator indexEnd = _indexes.end();
  while (indexStart != indexEnd) {
    Slice s(_start + pos + *indexStart);
    if (s.makeKey().isEqualString(key)) {
      return Slice(s.start() + s.byteSize());
    }
    ++indexStart;
  }
  return Slice();
}